

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::StrpTimeFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffff884;
  undefined4 in_stack_fffffffffffff88c;
  FunctionNullHandling in_stack_fffffffffffff898;
  allocator_type local_761;
  undefined8 in_stack_fffffffffffff8a0;
  code *bind_lambda;
  code *local_740 [2];
  code *local_730;
  code *local_728;
  LogicalType local_720;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_708;
  LogicalType local_6f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6d8;
  LogicalType list_type;
  LogicalType local_6a8 [4];
  string local_648;
  ScalarFunction fun;
  undefined1 local_500 [296];
  ScalarFunction local_3d8;
  ScalarFunction local_2b0;
  BaseScalarFunction local_188;
  BaseScalarFunction local_d8;
  
  ::std::__cxx11::string::string((string *)&local_648,"strptime",(allocator *)&fun);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_648);
  ::std::__cxx11::string::~string((string *)&local_648);
  LogicalType::LogicalType((LogicalType *)&fun,VARCHAR);
  LogicalType::LIST(&list_type,(LogicalType *)&fun);
  LogicalType::~LogicalType((LogicalType *)&fun);
  LogicalType::LogicalType((LogicalType *)local_500,VARCHAR);
  LogicalType::LogicalType((LogicalType *)(local_500 + 0x18),VARCHAR);
  __l._M_len = 2;
  __l._M_array = (iterator)local_500;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6d8,__l,(allocator_type *)local_6a8);
  LogicalType::LogicalType(&local_6f0,TIMESTAMP);
  local_740[1] = (code *)0x0;
  local_740[0] = StrpTimeFunction::Parse<duckdb::timestamp_t>;
  local_728 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_730 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(local_6a8 + 3,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = local_6a8 + 3;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff884;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff88c;
  ScalarFunction::ScalarFunction
            (&fun,(vector<duckdb::LogicalType,_true> *)&local_6d8,&local_6f0,
             (scalar_function_t *)local_740,StrpTimeFunction::Bind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffff898,
             (bind_lambda_function_t)in_stack_fffffffffffff8a0);
  LogicalType::~LogicalType(local_6a8 + 3);
  ::std::_Function_base::~_Function_base((_Function_base *)local_740);
  LogicalType::~LogicalType(&local_6f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6d8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_500 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  fun.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(&local_d8,&fun.super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d8);
  ScalarFunction::ScalarFunction(&local_2b0,&fun);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_2b0);
  ScalarFunction::~ScalarFunction(&local_2b0);
  LogicalType::LogicalType(local_6a8,VARCHAR);
  LogicalType::LogicalType(local_6a8 + 1,&list_type);
  __l_00._M_len = 2;
  __l_00._M_array = local_6a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_708,__l_00,&local_761);
  LogicalType::LogicalType(&local_720,TIMESTAMP);
  bind_lambda = StrpTimeFunction::Parse<duckdb::timestamp_t>;
  LogicalType::LogicalType(local_6a8 + 2,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = local_6a8 + 2;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff884;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff88c;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_500,(vector<duckdb::LogicalType,_true> *)&local_708,&local_720,
             (scalar_function_t *)&stack0xfffffffffffff8a0,StrpTimeFunction::Bind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffff898,bind_lambda);
  ScalarFunction::operator=(&fun,(ScalarFunction *)local_500);
  ScalarFunction::~ScalarFunction((ScalarFunction *)local_500);
  LogicalType::~LogicalType(local_6a8 + 2);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff8a0);
  LogicalType::~LogicalType(&local_720);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_708);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_6a8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(&local_188,&fun.super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_188);
  fun.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  ScalarFunction::ScalarFunction(&local_3d8,&fun);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3d8);
  ScalarFunction::~ScalarFunction(&local_3d8);
  ScalarFunction::~ScalarFunction(&fun);
  LogicalType::~LogicalType(&list_type);
  return in_RDI;
}

Assistant:

ScalarFunctionSet StrpTimeFun::GetFunctions() {
	ScalarFunctionSet strptime("strptime");

	const auto list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto fun = ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::TIMESTAMP,
	                          StrpTimeFunction::Parse<timestamp_t>, StrpTimeFunction::Bind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(fun);
	strptime.AddFunction(fun);

	fun = ScalarFunction({LogicalType::VARCHAR, list_type}, LogicalType::TIMESTAMP,
	                     StrpTimeFunction::Parse<timestamp_t>, StrpTimeFunction::Bind);
	BaseScalarFunction::SetReturnsError(fun);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	strptime.AddFunction(fun);
	return strptime;
}